

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

char * bam_flag2str(int flag)

{
  char *pcVar1;
  undefined1 local_28 [8];
  kstring_t str;
  int flag_local;
  
  str.s._4_4_ = flag;
  memset(local_28,0,0x18);
  if ((str.s._4_4_ & 1) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"PAIRED");
  }
  if ((str.s._4_4_ & 2) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"PROPER_PAIR");
  }
  if ((str.s._4_4_ & 4) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"UNMAP");
  }
  if ((str.s._4_4_ & 8) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"MUNMAP");
  }
  if ((str.s._4_4_ & 0x10) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"REVERSE");
  }
  if ((str.s._4_4_ & 0x20) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"MREVERSE");
  }
  if ((str.s._4_4_ & 0x40) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"READ1");
  }
  if ((str.s._4_4_ & 0x80) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"READ2");
  }
  if ((str.s._4_4_ & 0x100) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"SECONDARY");
  }
  if ((str.s._4_4_ & 0x200) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"QCFAIL");
  }
  if ((str.s._4_4_ & 0x400) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"DUP");
  }
  if ((str.s._4_4_ & 0x800) != 0) {
    pcVar1 = "";
    if (local_28 != (undefined1  [8])0x0) {
      pcVar1 = ",";
    }
    ksprintf((kstring_t *)local_28,"%s%s",pcVar1,"SUPPLEMENTARY");
  }
  if (local_28 == (undefined1  [8])0x0) {
    kputsn("",0,(kstring_t *)local_28);
  }
  return (char *)str.m;
}

Assistant:

char *bam_flag2str(int flag)
{
    kstring_t str = {0,0,0};
    if ( flag&BAM_FPAIRED ) ksprintf(&str,"%s%s", str.l?",":"","PAIRED");
    if ( flag&BAM_FPROPER_PAIR ) ksprintf(&str,"%s%s", str.l?",":"","PROPER_PAIR");
    if ( flag&BAM_FUNMAP ) ksprintf(&str,"%s%s", str.l?",":"","UNMAP");
    if ( flag&BAM_FMUNMAP ) ksprintf(&str,"%s%s", str.l?",":"","MUNMAP");
    if ( flag&BAM_FREVERSE ) ksprintf(&str,"%s%s", str.l?",":"","REVERSE");
    if ( flag&BAM_FMREVERSE ) ksprintf(&str,"%s%s", str.l?",":"","MREVERSE");
    if ( flag&BAM_FREAD1 ) ksprintf(&str,"%s%s", str.l?",":"","READ1");
    if ( flag&BAM_FREAD2 ) ksprintf(&str,"%s%s", str.l?",":"","READ2");
    if ( flag&BAM_FSECONDARY ) ksprintf(&str,"%s%s", str.l?",":"","SECONDARY");
    if ( flag&BAM_FQCFAIL ) ksprintf(&str,"%s%s", str.l?",":"","QCFAIL");
    if ( flag&BAM_FDUP ) ksprintf(&str,"%s%s", str.l?",":"","DUP");
    if ( flag&BAM_FSUPPLEMENTARY ) ksprintf(&str,"%s%s", str.l?",":"","SUPPLEMENTARY");
    if ( str.l == 0 ) kputsn("", 0, &str);
    return str.s;
}